

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void process(lzma_check_state *check)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t i;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint in_R8D;
  uint uVar21;
  uint in_R10D;
  uint uVar22;
  uint uVar23;
  uint in_R11D;
  uint uVar24;
  uint uVar25;
  ulong unaff_R12;
  uint uVar26;
  uint32_t uVar27;
  uint uVar28;
  uint32_t uVar29;
  uint32_t data [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_134;
  uint local_130;
  uint local_120;
  uint local_78 [18];
  
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    uVar1 = (check->buffer).u32[lVar9];
    local_78[lVar9] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar2 = (check->state).sha256.state[1];
  uVar3 = (check->state).sha256.state[2];
  uVar1 = (check->state).sha256.state[3];
  uVar4 = (check->state).sha256.state[4];
  uVar5 = (check->state).sha256.state[5];
  uVar6 = (check->state).sha256.state[6];
  uVar7 = (check->state).sha256.state[7];
  uVar18 = (check->state).crc32;
  uVar27 = uVar2;
  uVar29 = uVar3;
  uVar19 = uVar6;
  uVar10 = local_78[0xf];
  uVar8 = uVar4;
  uVar20 = uVar1;
  local_134 = uVar5;
  local_130 = uVar7;
  for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 0x10) {
    uVar13 = local_78[2];
    uVar22 = local_78[0];
    uVar14 = local_78[1];
    if (uVar17 != 0) {
      uVar22 = in_R10D + local_14c +
               (local_120 >> 10 ^
               (local_120 << 0xd | local_120 >> 0x13) ^ (local_120 << 0xf | local_120 >> 0x11)) +
               (in_R11D >> 3 ^ (in_R11D << 0xe | in_R11D >> 0x12) ^ (in_R11D << 0x19 | in_R11D >> 7)
               );
      uVar13 = in_R8D + local_154 +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) +
               (uVar22 >> 10 ^
               (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      uVar14 = in_R11D + local_160 +
               (local_148 >> 10 ^
               (local_148 << 0xd | local_148 >> 0x13) ^ (local_148 << 0xf | local_148 >> 0x11)) +
               (in_R8D >> 3 ^ (in_R8D << 0xe | in_R8D >> 0x12) ^ (in_R8D << 0x19 | in_R8D >> 7));
    }
    in_R11D = uVar14;
    in_R10D = uVar22;
    in_R8D = uVar13;
    uVar21 = (uint)unaff_R12;
    uVar14 = local_78[8];
    uVar13 = local_78[7];
    uVar12 = local_78[6];
    uVar11 = local_78[3];
    uVar22 = local_78[4];
    uVar25 = local_78[5];
    if (uVar17 != 0) {
      uVar11 = uVar10 + local_144 +
               ((uint)(unaff_R12 >> 3) & 0x1fffffff ^
               (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) +
               (in_R11D >> 10 ^
               (in_R11D << 0xd | in_R11D >> 0x13) ^ (in_R11D << 0xf | in_R11D >> 0x11));
      uVar22 = uVar21 + local_140 +
               (local_158 >> 3 ^
               (local_158 << 0xe | local_158 >> 0x12) ^ (local_158 << 0x19 | local_158 >> 7)) +
               (in_R8D >> 10 ^ (in_R8D << 0xd | in_R8D >> 0x13) ^ (in_R8D << 0xf | in_R8D >> 0x11));
      uVar25 = local_158 + local_120 +
               (local_15c >> 3 ^
               (local_15c << 0xe | local_15c >> 0x12) ^ (local_15c << 0x19 | local_15c >> 7)) +
               (uVar11 >> 10 ^
               (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
      uVar12 = local_15c + local_148 +
               (local_150 >> 3 ^
               (local_150 << 0xe | local_150 >> 0x12) ^ (local_150 << 0x19 | local_150 >> 7)) +
               (uVar22 >> 10 ^
               (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      uVar13 = local_150 + in_R10D +
               (local_13c >> 3 ^
               (local_13c << 0xe | local_13c >> 0x12) ^ (local_13c << 0x19 | local_13c >> 7)) +
               (uVar25 >> 10 ^
               (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      uVar14 = local_13c + in_R11D +
               (local_14c >> 3 ^
               (local_14c << 0xe | local_14c >> 0x12) ^ (local_14c << 0x19 | local_14c >> 7)) +
               (uVar12 >> 10 ^
               (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
    }
    local_158 = uVar25;
    uVar10 = uVar11;
    local_15c = uVar12;
    local_150 = local_78[9];
    if (uVar17 != 0) {
      local_150 = local_14c + in_R8D +
                  (local_160 >> 3 ^
                  (local_160 << 0xe | local_160 >> 0x12) ^ (local_160 << 0x19 | local_160 >> 7)) +
                  (uVar13 >> 10 ^
                  (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11));
    }
    uVar12 = local_78[10];
    if (uVar17 != 0) {
      uVar12 = local_160 + uVar10 +
               (local_154 >> 3 ^
               (local_154 << 0xe | local_154 >> 0x12) ^ (local_154 << 0x19 | local_154 >> 7)) +
               (uVar14 >> 10 ^ (uVar14 << 0xd | uVar14 >> 0x13) ^ (uVar14 << 0xf | uVar14 >> 0x11));
    }
    local_160 = local_78[0xb];
    if (uVar17 != 0) {
      local_160 = local_154 + uVar22 +
                  (local_144 >> 3 ^
                  (local_144 << 0xe | local_144 >> 0x12) ^ (local_144 << 0x19 | local_144 >> 7)) +
                  (local_150 >> 10 ^
                  (local_150 << 0xd | local_150 >> 0x13) ^ (local_150 << 0xf | local_150 >> 0x11));
    }
    local_154 = local_78[0xc];
    if (uVar17 != 0) {
      local_154 = local_144 + local_158 +
                  (local_140 >> 3 ^
                  (local_140 << 0xe | local_140 >> 0x12) ^ (local_140 << 0x19 | local_140 >> 7)) +
                  (uVar12 >> 10 ^
                  (uVar12 << 0xd | uVar12 >> 0x13) ^ (uVar12 << 0xf | uVar12 >> 0x11));
    }
    uVar11 = local_78[0xd];
    if (uVar17 != 0) {
      uVar11 = local_140 + local_15c +
               (local_120 >> 3 ^
               (local_120 << 0xe | local_120 >> 0x12) ^ (local_120 << 0x19 | local_120 >> 7)) +
               (local_160 >> 10 ^
               (local_160 << 0xd | local_160 >> 0x13) ^ (local_160 << 0xf | local_160 >> 0x11));
    }
    uVar25 = local_78[0xe];
    if (uVar17 != 0) {
      uVar25 = local_120 + uVar13 +
               (local_148 >> 3 ^
               (local_148 << 0xe | local_148 >> 0x12) ^ (local_148 << 0x19 | local_148 >> 7)) +
               (local_154 >> 10 ^
               (local_154 << 0xd | local_154 >> 0x13) ^ (local_154 << 0xf | local_154 >> 0x11));
    }
    uVar21 = local_78[0xf];
    if (uVar17 != 0) {
      uVar21 = local_148 + uVar14 +
               (in_R10D >> 3 ^ (in_R10D << 0xe | in_R10D >> 0x12) ^ (in_R10D << 0x19 | in_R10D >> 7)
               ) + (uVar11 >> 10 ^
                   (uVar11 << 0xd | uVar11 >> 0x13) ^ (uVar11 << 0xf | uVar11 >> 0x11));
    }
    iVar15 = ((local_134 ^ uVar19) & uVar8 ^ uVar19) + local_130 +
             ((uVar8 << 7 | uVar8 >> 0x19) ^
             (uVar8 << 0x15 | uVar8 >> 0xb) ^ (uVar8 << 0x1a | uVar8 >> 6)) + in_R10D +
             SHA256_K[uVar17];
    uVar20 = uVar20 + iVar15;
    uVar24 = ((uVar18 | uVar27) & uVar29 | uVar18 & uVar27) +
             ((uVar18 << 10 | uVar18 >> 0x16) ^
             (uVar18 << 0x13 | uVar18 >> 0xd) ^ (uVar18 << 0x1e | uVar18 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 1] + uVar19 + ((uVar8 ^ local_134) & uVar20 ^ local_134) + in_R11D +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar28 = uVar29 + iVar15;
    uVar19 = ((uVar24 | uVar18) & uVar27 | uVar24 & uVar18) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 2] + local_134 + ((uVar20 ^ uVar8) & uVar28 ^ uVar8) + in_R8D +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6));
    uVar26 = uVar27 + iVar15;
    uVar16 = ((uVar19 | uVar24) & uVar18 | uVar19 & uVar24) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 3] + uVar8 + ((uVar28 ^ uVar20) & uVar26 ^ uVar20) + uVar10 +
             ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6));
    uVar18 = uVar18 + iVar15;
    uVar8 = ((uVar16 | uVar19) & uVar24 | uVar16 & uVar19) +
            ((uVar16 * 0x400 | uVar16 >> 0x16) ^
            (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 4] + uVar20 + ((uVar26 ^ uVar28) & uVar18 ^ uVar28) + uVar22 +
             ((uVar18 * 0x80 | uVar18 >> 0x19) ^
             (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
    uVar24 = uVar24 + iVar15;
    uVar20 = ((uVar8 | uVar16) & uVar19 | uVar8 & uVar16) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 5] + uVar28 + ((uVar18 ^ uVar26) & uVar24 ^ uVar26) + local_158 +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6));
    uVar19 = uVar19 + iVar15;
    uVar28 = ((uVar20 | uVar8) & uVar16 | uVar20 & uVar8) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 6] + uVar26 + ((uVar24 ^ uVar18) & uVar19 ^ uVar18) + local_15c +
             ((uVar19 * 0x80 | uVar19 >> 0x19) ^
             (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
    uVar16 = uVar16 + iVar15;
    uVar23 = ((uVar28 | uVar20) & uVar8 | uVar28 & uVar20) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 7] + uVar18 + ((uVar19 ^ uVar24) & uVar16 ^ uVar24) + uVar13 +
             ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6));
    uVar8 = uVar8 + iVar15;
    uVar26 = ((uVar23 | uVar28) & uVar20 | uVar23 & uVar28) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 8] + uVar24 + ((uVar16 ^ uVar19) & uVar8 ^ uVar19) + uVar14 +
             ((uVar8 * 0x80 | uVar8 >> 0x19) ^
             (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
    uVar20 = uVar20 + iVar15;
    local_130 = ((uVar26 | uVar23) & uVar28 | uVar26 & uVar23) +
                ((uVar26 * 0x400 | uVar26 >> 0x16) ^
                (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 9] + uVar19 + ((uVar8 ^ uVar16) & uVar20 ^ uVar16) + local_150 +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar28 = uVar28 + iVar15;
    uVar19 = ((local_130 | uVar26) & uVar23 | local_130 & uVar26) +
             ((local_130 * 0x400 | local_130 >> 0x16) ^
             (local_130 * 0x80000 | local_130 >> 0xd) ^ (local_130 * 0x40000000 | local_130 >> 2)) +
             iVar15;
    iVar15 = SHA256_K[uVar17 + 10] + uVar16 + ((uVar20 ^ uVar8) & uVar28 ^ uVar8) + uVar12 +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6));
    uVar23 = uVar23 + iVar15;
    uVar18 = ((uVar19 | local_130) & uVar26 | uVar19 & local_130) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 0xb] + uVar8 + ((uVar28 ^ uVar20) & uVar23 ^ uVar20) + local_160 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar26 = uVar26 + iVar15;
    uVar8 = ((uVar18 | uVar19) & local_130 | uVar18 & uVar19) +
            ((uVar18 * 0x400 | uVar18 >> 0x16) ^
            (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar15;
    local_144 = local_154;
    iVar15 = SHA256_K[uVar17 + 0xc] + uVar20 + ((uVar23 ^ uVar28) & uVar26 ^ uVar28) + local_154 +
             ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6));
    local_130 = local_130 + iVar15;
    uVar20 = ((uVar8 | uVar18) & uVar19 | uVar8 & uVar18) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 0xd] + uVar28 + ((uVar26 ^ uVar23) & local_130 ^ uVar23) + uVar11 +
             ((local_130 * 0x80 | local_130 >> 0x19) ^
             (local_130 * 0x200000 | local_130 >> 0xb) ^ (local_130 * 0x4000000 | local_130 >> 6));
    uVar19 = uVar19 + iVar15;
    uVar29 = ((uVar20 | uVar8) & uVar18 | uVar20 & uVar8) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 0xe] + uVar23 + ((local_130 ^ uVar26) & uVar19 ^ uVar26) + uVar25 +
             ((uVar19 * 0x80 | uVar19 >> 0x19) ^
             (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
    local_134 = uVar18 + iVar15;
    uVar27 = ((uVar29 | uVar20) & uVar8 | uVar29 & uVar20) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar15;
    iVar15 = SHA256_K[uVar17 + 0xf] + uVar26 + ((uVar19 ^ local_130) & local_134 ^ local_130) +
             uVar21 + ((local_134 * 0x80 | local_134 >> 0x19) ^
                      (local_134 * 0x200000 | local_134 >> 0xb) ^
                      (local_134 * 0x4000000 | local_134 >> 6));
    uVar8 = uVar8 + iVar15;
    uVar18 = ((uVar27 | uVar29) & uVar20 | uVar27 & uVar29) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar15;
    local_154 = local_160;
    local_14c = local_150;
    unaff_R12 = (ulong)uVar22;
    local_160 = uVar12;
    local_150 = uVar13;
    local_148 = uVar21;
    local_140 = uVar11;
    local_13c = uVar14;
    local_120 = uVar25;
  }
  (check->state).crc32 = uVar18 + (check->state).crc32;
  (check->state).sha256.state[1] = uVar27 + uVar2;
  (check->state).sha256.state[2] = uVar29 + uVar3;
  (check->state).sha256.state[3] = uVar20 + uVar1;
  (check->state).sha256.state[4] = uVar8 + uVar4;
  (check->state).sha256.state[5] = local_134 + uVar5;
  (check->state).sha256.state[6] = uVar19 + uVar6;
  (check->state).sha256.state[7] = local_130 + uVar7;
  return;
}

Assistant:

static void
process(lzma_check_state *check)
{
#ifdef WORDS_BIGENDIAN
	transform(check->state.sha256.state, check->buffer.u32);

#else
	uint32_t data[16];
	size_t i;

	for (i = 0; i < 16; ++i)
		data[i] = bswap32(check->buffer.u32[i]);

	transform(check->state.sha256.state, data);
#endif

	return;
}